

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_pop_reg(void *addr)

{
  Memslot id;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_pop_reg: can only be called within SPMD section\n");
  }
  id = bsplib::Rdma::lookup_reg(s_rdma,addr,true,false);
  if (id == 0xffffffffffffffff) {
    bsp_abort("bsp_pop_reg: memory at address %p was not registered\n",addr);
  }
  bsplib::Rdma::pop_reg(s_rdma,id);
  return;
}

Assistant:

void bsp_pop_reg( const void * addr )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_pop_reg: can only be called within SPMD section\n");

    bsplib::Rdma::Memslot slot = s_rdma->lookup_reg( addr, true, false );
    if ( s_rdma->no_slot() == slot )
        bsp_abort("bsp_pop_reg: memory at address %p was not registered\n",
                addr );

    s_rdma->pop_reg( slot );
}